

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_AsmStatement(SyntaxDumper *this,ExtGNU_AsmStatementSyntax *node)

{
  ExpressionSyntax *pEVar1;
  ExtGNU_AsmStatementSyntax local_2f0 [56];
  ExtGNU_AsmStatementSyntax local_2b8 [56];
  SyntaxToken local_280 [56];
  ExpressionListSyntax *local_248;
  ExpressionListSyntax *it_4;
  SyntaxToken local_208 [56];
  ExpressionListSyntax *local_1d0;
  ExpressionListSyntax *it_3;
  SyntaxToken local_190 [56];
  ExtGNU_AsmOperandListSyntax *local_158;
  ExtGNU_AsmOperandListSyntax *it_2;
  SyntaxToken local_118 [56];
  ExtGNU_AsmOperandListSyntax *local_e0;
  ExtGNU_AsmOperandListSyntax *it_1;
  ExtGNU_AsmStatementSyntax local_a0 [56];
  SpecifierListSyntax *local_68;
  SpecifierListSyntax *it;
  ExtGNU_AsmStatementSyntax local_50 [56];
  ExtGNU_AsmStatementSyntax *local_18;
  ExtGNU_AsmStatementSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ExtGNU_AsmStatementSyntax *)this;
  ExtGNU_AsmStatementSyntax::asmKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  for (local_68 = ExtGNU_AsmStatementSyntax::asmQualifiers(local_18);
      local_68 != (SpecifierListSyntax *)0x0; local_68 = *(SpecifierListSyntax **)(local_68 + 0x10))
  {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_68 + 8));
  }
  ExtGNU_AsmStatementSyntax::openParenthesisToken(local_a0);
  (**(code **)(*(long *)this + 0x2e8))(this,local_a0,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_a0);
  pEVar1 = ExtGNU_AsmStatementSyntax::stringLiteral(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  ExtGNU_AsmStatementSyntax::colon1Token((ExtGNU_AsmStatementSyntax *)&it_1);
  (**(code **)(*(long *)this + 0x2e8))(this,(ExtGNU_AsmStatementSyntax *)&it_1,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)&it_1);
  for (local_e0 = ExtGNU_AsmStatementSyntax::outputOperands(local_18);
      local_e0 != (ExtGNU_AsmOperandListSyntax *)0x0;
      local_e0 = *(ExtGNU_AsmOperandListSyntax **)(local_e0 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_e0 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,local_118,local_18);
    psy::C::SyntaxToken::~SyntaxToken(local_118);
  }
  ExtGNU_AsmStatementSyntax::colon2Token((ExtGNU_AsmStatementSyntax *)&it_2);
  (**(code **)(*(long *)this + 0x2e8))(this,(ExtGNU_AsmStatementSyntax *)&it_2,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)&it_2);
  for (local_158 = ExtGNU_AsmStatementSyntax::inputOperands(local_18);
      local_158 != (ExtGNU_AsmOperandListSyntax *)0x0;
      local_158 = *(ExtGNU_AsmOperandListSyntax **)(local_158 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_158 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::ExtGNU_AsmOperandSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,local_190,local_18);
    psy::C::SyntaxToken::~SyntaxToken(local_190);
  }
  ExtGNU_AsmStatementSyntax::colon3Token((ExtGNU_AsmStatementSyntax *)&it_3);
  (**(code **)(*(long *)this + 0x2e8))(this,(ExtGNU_AsmStatementSyntax *)&it_3,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)&it_3);
  for (local_1d0 = ExtGNU_AsmStatementSyntax::clobbers(local_18);
      local_1d0 != (ExpressionListSyntax *)0x0;
      local_1d0 = *(ExpressionListSyntax **)(local_1d0 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_1d0 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,local_208,local_18);
    psy::C::SyntaxToken::~SyntaxToken(local_208);
  }
  ExtGNU_AsmStatementSyntax::colon4Token((ExtGNU_AsmStatementSyntax *)&it_4);
  (**(code **)(*(long *)this + 0x2e8))(this,(ExtGNU_AsmStatementSyntax *)&it_4,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)&it_4);
  for (local_248 = ExtGNU_AsmStatementSyntax::gotoLabels(local_18);
      local_248 != (ExpressionListSyntax *)0x0;
      local_248 = *(ExpressionListSyntax **)(local_248 + 0x10)) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(local_248 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::ExpressionSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,local_280,local_18);
    psy::C::SyntaxToken::~SyntaxToken(local_280);
  }
  ExtGNU_AsmStatementSyntax::closeParenthesisToken(local_2b8);
  (**(code **)(*(long *)this + 0x2e8))(this,local_2b8,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_2b8);
  ExtGNU_AsmStatementSyntax::semicolonToken(local_2f0);
  (**(code **)(*(long *)this + 0x2e8))(this,local_2f0,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_2f0);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_AsmStatement(const ExtGNU_AsmStatementSyntax* node) override
    {
        terminal(node->asmKeyword(), node);
        for (auto it = node->asmQualifiers(); it; it = it->next)
            nonterminal(it->value);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->stringLiteral());
        terminal(node->colon1Token(), node);
        for (auto it = node->outputOperands(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon2Token(), node);
        for (auto it = node->inputOperands(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon3Token(), node);
        for (auto it = node->clobbers(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->colon4Token(), node);
        for (auto it = node->gotoLabels(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->closeParenthesisToken(), node);
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }